

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraImp.c
# Opt level: O1

int Fra_ImpVerifyUsingSimulation(Fra_Man_t *p)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  Vec_Int_t *pVVar5;
  int *piVar6;
  Fra_Sml_t *p_00;
  void *__s;
  int iVar7;
  size_t sVar8;
  undefined1 uVar9;
  long lVar10;
  size_t __size;
  
  pVVar5 = p->pCla->vImps;
  iVar7 = 0;
  if ((pVVar5 != (Vec_Int_t *)0x0) && (iVar7 = 0, pVVar5->nSize != 0)) {
    p_00 = Fra_SmlSimulateSeq(p->pManAig,p->pPars->nFramesP,2000,8,1);
    pVVar5 = p->pCla->vImps;
    iVar1 = pVVar5->nSize;
    __size = (size_t)iVar1;
    __s = malloc(__size);
    iVar7 = 0;
    memset(__s,0,__size);
    if (0 < (long)__size) {
      piVar6 = pVVar5->pArray;
      iVar2 = p_00->nWordsTotal;
      iVar3 = p_00->nWordsPref;
      sVar8 = 0;
      do {
        if (iVar3 < iVar2) {
          uVar4 = piVar6[sVar8];
          lVar10 = 0;
          do {
            if ((*(uint *)((long)&p_00[1].pAig +
                          lVar10 * 4 + (long)(int)((uVar4 & 0xffff) * iVar2) * 4 + (long)iVar3 * 4)
                & ~*(uint *)((long)&p_00[1].pAig +
                            lVar10 * 4 + (long)(((int)uVar4 >> 0x10) * iVar2) * 4 + (long)iVar3 * 4)
                ) != 0) {
              uVar9 = 1;
              goto LAB_0068eaac;
            }
            lVar10 = lVar10 + 1;
          } while (iVar2 - iVar3 != (int)lVar10);
        }
        uVar9 = 0;
LAB_0068eaac:
        *(undefined1 *)((long)__s + sVar8) = uVar9;
        sVar8 = sVar8 + 1;
      } while (sVar8 != __size);
    }
    if (0 < iVar1) {
      sVar8 = 0;
      iVar7 = 0;
      do {
        iVar7 = iVar7 + *(char *)((long)__s + sVar8);
        sVar8 = sVar8 + 1;
      } while (__size != sVar8);
    }
    if (__s != (void *)0x0) {
      free(__s);
    }
    Fra_SmlStop(p_00);
  }
  return iVar7;
}

Assistant:

int Fra_ImpVerifyUsingSimulation( Fra_Man_t * p )
{
    int nFrames = 2000;
    int nSimWords = 8;
    Fra_Sml_t * pSeq;
    char * pfFails;
    int Left, Right, Imp, i, Counter;
    if ( p->pCla->vImps == NULL || Vec_IntSize(p->pCla->vImps) == 0 )
        return 0;
    // simulate the AIG manager with combinational patterns
    pSeq = Fra_SmlSimulateSeq( p->pManAig, p->pPars->nFramesP, nFrames, nSimWords, 1  );
    // go through the implications and check how many of them do not hold
    pfFails = ABC_ALLOC( char, Vec_IntSize(p->pCla->vImps) );
    memset( pfFails, 0, sizeof(char) * Vec_IntSize(p->pCla->vImps) );
    Vec_IntForEachEntry( p->pCla->vImps, Imp, i )
    {
        Left = Fra_ImpLeft(Imp);
        Right = Fra_ImpRight(Imp);
        pfFails[i] = !Sml_NodeCheckImp( pSeq, Left, Right );
    }
    // count how many has failed
    Counter = 0;
    for ( i = 0; i < Vec_IntSize(p->pCla->vImps); i++ )
        Counter += pfFails[i];
    ABC_FREE( pfFails );
    Fra_SmlStop( pSeq );
    return Counter;
}